

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O3

void __thiscall NaPNStatistics::action(NaPNStatistics *this)

{
  NaVector *pNVar1;
  NaVector *this_00;
  double dVar2;
  double dVar3;
  NaReal NVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  NaVector *pNVar11;
  undefined4 extraout_var;
  NaReal *pNVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  NaPetriNet *pNVar13;
  NaTimer *pNVar14;
  undefined4 extraout_var_06;
  double *pdVar15;
  NaVector *pNVar16;
  undefined4 extraout_var_07;
  NaReal *pNVar17;
  char *pcVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  NaVector *pNVar22;
  bool bVar23;
  bool bVar24;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar25;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar26;
  double dVar27;
  
  pNVar11 = NaPetriCnInput::data(&this->signal);
  uVar19 = this->nGapAct;
  if (this->nGapWidth - 1 < uVar19) {
    NaVector::init_zero(&this->Mean);
    NaVector::init_zero(&this->RMS);
    NaVector::init_zero(&this->StdDev);
    NaVector::init_zero(&this->Min);
    NaVector::init_zero(&this->Max);
    NaVector::init_zero(&this->Sum);
    NaVector::init_zero(&this->Sum2);
    uVar19 = 0;
  }
  this->nGapAct = uVar19 + 1;
  iVar7 = (*pNVar11->_vptr_NaVector[6])(pNVar11);
  if (iVar7 != 0) {
    pNVar1 = &this->Mean;
    uVar19 = 0;
    do {
      iVar7 = (*pNVar11->_vptr_NaVector[8])(pNVar11,(ulong)uVar19);
      dVar2 = *(double *)CONCAT44(extraout_var,iVar7);
      pNVar12 = NaVector::operator[](&this->Sum,uVar19);
      *pNVar12 = dVar2 + *pNVar12;
      iVar7 = (*pNVar11->_vptr_NaVector[8])(pNVar11,(ulong)uVar19);
      dVar2 = *(double *)CONCAT44(extraout_var_00,iVar7);
      iVar7 = (*pNVar11->_vptr_NaVector[8])(pNVar11,(ulong)uVar19);
      dVar3 = *(double *)CONCAT44(extraout_var_01,iVar7);
      pNVar12 = NaVector::operator[](&this->Sum2,uVar19);
      *pNVar12 = dVar2 * dVar3 + *pNVar12;
      uVar8 = this->nGapAct;
      iVar7 = (*pNVar11->_vptr_NaVector[8])(pNVar11,(ulong)uVar19);
      dVar2 = *(double *)CONCAT44(extraout_var_02,iVar7);
      pNVar12 = NaVector::operator[](&this->Min,uVar19);
      if (uVar8 == 1) {
        *pNVar12 = dVar2;
LAB_001412e8:
        iVar7 = (*pNVar11->_vptr_NaVector[8])(pNVar11,(ulong)uVar19);
        NVar4 = *(NaReal *)CONCAT44(extraout_var_05,iVar7);
        pNVar12 = NaVector::operator[](&this->Max,uVar19);
        *pNVar12 = NVar4;
      }
      else {
        if (dVar2 < *pNVar12) {
          iVar7 = (*pNVar11->_vptr_NaVector[8])(pNVar11,(ulong)uVar19);
          NVar4 = *(NaReal *)CONCAT44(extraout_var_03,iVar7);
          pNVar12 = NaVector::operator[](&this->Min,uVar19);
          *pNVar12 = NVar4;
        }
        iVar7 = (*pNVar11->_vptr_NaVector[8])(pNVar11,(ulong)uVar19);
        dVar2 = *(double *)CONCAT44(extraout_var_04,iVar7);
        pNVar12 = NaVector::operator[](&this->Max,uVar19);
        if (*pNVar12 <= dVar2 && dVar2 != *pNVar12) goto LAB_001412e8;
      }
      pNVar12 = NaVector::operator[](&this->Sum,uVar19);
      dVar2 = *pNVar12;
      uVar8 = this->nGapAct;
      pNVar12 = NaVector::operator[](pNVar1,uVar19);
      *pNVar12 = dVar2 / (double)uVar8;
      pNVar12 = NaVector::operator[](&this->Sum2,uVar19);
      dVar2 = *pNVar12;
      uVar8 = this->nGapAct;
      pNVar12 = NaVector::operator[](&this->RMS,uVar19);
      *pNVar12 = dVar2 / (double)uVar8;
      pNVar12 = NaVector::operator[](&this->RMS,uVar19);
      dVar2 = *pNVar12;
      pNVar12 = NaVector::operator[](pNVar1,uVar19);
      dVar3 = *pNVar12;
      pNVar12 = NaVector::operator[](pNVar1,uVar19);
      dVar2 = dVar2 - dVar3 * *pNVar12;
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      pNVar12 = NaVector::operator[](&this->StdDev,uVar19);
      *pNVar12 = dVar2;
      uVar19 = uVar19 + 1;
      uVar8 = (*pNVar11->_vptr_NaVector[6])(pNVar11);
    } while (uVar19 < uVar8);
  }
  pNVar1 = &this->Min;
  pNVar12 = NaVector::operator[](pNVar1,0);
  dVar2 = *pNVar12;
  this_00 = &this->Max;
  pNVar12 = NaVector::operator[](this_00,0);
  pNVar22 = this_00;
  if (ABS(*pNVar12) < ABS(dVar2)) {
    pNVar22 = pNVar1;
  }
  pNVar12 = NaVector::operator[](pNVar22,0);
  dVar3 = ABS(*pNVar12);
  pNVar13 = NaPetriNode::net(&this->super_NaPetriNode);
  pNVar14 = NaPetriNet::timer(pNVar13);
  (*pNVar14->_vptr_NaTimer[4])(pNVar14);
  dVar2 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  pNVar13 = NaPetriNode::net(&this->super_NaPetriNode);
  pNVar14 = NaPetriNet::timer(pNVar13);
  iVar7 = (*pNVar14->_vptr_NaTimer[5])(pNVar14);
  dVar6 = (double)iVar7;
  pNVar22 = &this->Mean;
  iVar7 = 0;
  do {
    uVar19 = 1 << ((byte)iVar7 & 0x1f) & (uint)(ushort)this->mOutStat;
    if (0x1f < uVar19) {
      if (0x7f < uVar19) {
        dVar5 = dVar2;
        if ((uVar19 == 0x80) || (dVar5 = dVar6, uVar19 == 0x100)) goto LAB_001415b7;
        if (uVar19 != 0x200) goto switchD_00141524_caseD_3;
        iVar9 = (*pNVar11->_vptr_NaVector[8])(pNVar11,0);
        pdVar15 = (double *)CONCAT44(extraout_var_06,iVar9);
        goto LAB_001415b3;
      }
      pNVar16 = pNVar1;
      if (uVar19 == 0x20) goto LAB_001415ac;
      dVar5 = dVar3;
      if (uVar19 != 0x40) goto switchD_00141524_caseD_3;
      goto LAB_001415b7;
    }
    switch(uVar19) {
    case 1:
      pNVar12 = NaVector::operator[](pNVar22,0);
      dVar5 = ABS(*pNVar12);
      goto LAB_001415b7;
    case 2:
      pNVar16 = pNVar22;
      break;
    case 3:
    case 5:
    case 6:
    case 7:
      goto switchD_00141524_caseD_3;
    case 4:
      pNVar16 = &this->RMS;
      break;
    case 8:
      pNVar16 = &this->StdDev;
      break;
    default:
      pNVar16 = this_00;
      if (uVar19 == 0x10) break;
      goto switchD_00141524_caseD_3;
    }
LAB_001415ac:
    pdVar15 = NaVector::operator[](pNVar16,0);
LAB_001415b3:
    dVar5 = *pdVar15;
LAB_001415b7:
    pNVar16 = NaPetriCnOutput::data(&this->stat);
    iVar9 = (*pNVar16->_vptr_NaVector[8])(pNVar16);
    *(double *)CONCAT44(extraout_var_07,iVar9) = dVar5;
switchD_00141524_caseD_3:
    iVar7 = iVar7 + 1;
  } while (iVar7 != 10);
  if (this->nGapWidth - 1 < this->nGapAct) {
    pNVar12 = &this->HaltCond[0].value;
    lVar20 = 0;
    uVar19 = 0;
    do {
      uVar8 = 1 << ((byte)lVar20 & 0x1f);
      uVar10 = this->mHalt & uVar8 & 0xffff;
      if (0x1f < uVar10) {
        if (uVar10 < 0x80) {
          pNVar11 = pNVar1;
          if (uVar10 == 0x20) goto LAB_001416f8;
          if (uVar10 == 0x40) {
            dVar5 = *pNVar12;
            uVar25 = SUB84(dVar5,0);
            uVar26 = (undefined4)((ulong)dVar5 >> 0x20);
            if (-1 < ((anon_struct_16_2_f898271f *)(pNVar12 + -1))->sign) {
              dVar27 = dVar3;
              if (((anon_struct_16_2_f898271f *)(pNVar12 + -1))->sign != 0) goto LAB_00141736;
              bVar24 = dVar5 == dVar3;
              goto LAB_0014173d;
            }
            bVar24 = dVar5 == dVar3;
            bVar23 = dVar5 < dVar3;
            goto LAB_0014173a;
          }
          goto switchD_00141653_caseD_3;
        }
        if (uVar10 == 0x80) {
          dVar5 = *pNVar12;
          uVar25 = SUB84(dVar5,0);
          uVar26 = (undefined4)((ulong)dVar5 >> 0x20);
          if (-1 < ((anon_struct_16_2_f898271f *)(pNVar12 + -1))->sign) {
            dVar27 = dVar2;
            if (((anon_struct_16_2_f898271f *)(pNVar12 + -1))->sign == 0) {
              bVar24 = dVar5 == dVar2;
              goto LAB_0014173d;
            }
            goto LAB_00141736;
          }
          bVar24 = dVar5 == dVar2;
          bVar23 = dVar5 < dVar2;
          goto LAB_0014173a;
        }
        if (uVar10 != 0x100) goto switchD_00141653_caseD_3;
        dVar5 = *pNVar12;
        uVar25 = SUB84(dVar5,0);
        uVar26 = (undefined4)((ulong)dVar5 >> 0x20);
        if (((anon_struct_16_2_f898271f *)(pNVar12 + -1))->sign < 0) {
          bVar24 = dVar5 == dVar6;
          bVar23 = dVar5 < dVar6;
          goto LAB_0014173a;
        }
        dVar27 = dVar6;
        if (((anon_struct_16_2_f898271f *)(pNVar12 + -1))->sign != 0) goto LAB_00141736;
        bVar24 = dVar5 == dVar6;
        goto LAB_0014173d;
      }
      switch(uVar10) {
      case 1:
        pNVar17 = NaVector::operator[](pNVar22,0);
        uVar25 = SUB84(ABS(*pNVar17),0);
        uVar26 = (undefined4)((ulong)ABS(*pNVar17) >> 0x20);
        goto LAB_00141703;
      case 2:
        pNVar11 = pNVar22;
        break;
      case 3:
      case 5:
      case 6:
      case 7:
        goto switchD_00141653_caseD_3;
      case 4:
        pNVar11 = &this->RMS;
        break;
      case 8:
        pNVar11 = &this->StdDev;
        break;
      default:
        pNVar11 = this_00;
        if (uVar10 == 0x10) break;
        goto switchD_00141653_caseD_3;
      }
LAB_001416f8:
      pNVar17 = NaVector::operator[](pNVar11,0);
      uVar25 = SUB84(*pNVar17,0);
      uVar26 = (undefined4)((ulong)*pNVar17 >> 0x20);
LAB_00141703:
      dVar27 = *pNVar12;
      if (((anon_struct_16_2_f898271f *)(pNVar12 + -1))->sign < 0) {
LAB_00141736:
        bVar24 = dVar27 == (double)CONCAT44(uVar26,uVar25);
        bVar23 = dVar27 < (double)CONCAT44(uVar26,uVar25);
LAB_0014173a:
        bVar24 = !bVar23 && !bVar24;
      }
      else {
        if (((anon_struct_16_2_f898271f *)(pNVar12 + -1))->sign != 0) {
          bVar24 = (double)CONCAT44(uVar26,uVar25) == dVar27;
          bVar23 = (double)CONCAT44(uVar26,uVar25) < dVar27;
          goto LAB_0014173a;
        }
        bVar24 = (double)CONCAT44(uVar26,uVar25) == dVar27;
      }
LAB_0014173d:
      if (!bVar24) {
        uVar8 = 0;
      }
      uVar19 = uVar19 | uVar8;
switchD_00141653_caseD_3:
      lVar20 = lVar20 + 1;
      pNVar12 = pNVar12 + 2;
    } while (lVar20 != 10);
    if ((uVar19 & 0x3ff) != 0) {
      pcVar18 = NaPetriNode::name(&this->super_NaPetriNode);
      lVar21 = 0;
      NaPrintLog("Statistics node \'%s\' caused halt due to:\n",pcVar18);
      lVar20 = 0;
      do {
        if ((uVar19 >> ((uint)lVar20 & 0x1f) & 1) != 0) {
          NaPrintLog("  %s[0] %s %g\n",
                     (int)*(undefined8 *)((long)&this->HaltCond[0].value + lVar21 * 2),
                     *(undefined8 *)((long)szId + lVar21),
                     szSign[(long)*(int *)((long)&this->HaltCond[0].sign + lVar21 * 2) + 1]);
        }
        lVar20 = lVar20 + 1;
        lVar21 = lVar21 + 8;
      } while (lVar20 != 10);
      (*(this->super_NaPetriNode)._vptr_NaPetriNode[5])();
      return;
    }
  }
  return;
}

Assistant:

void
NaPNStatistics::action ()
{
  unsigned    i;
  NaVector    &x = signal.data();

  if(nGapAct >= nGapWidth && nGapWidth > 0)
    {
      // prepare next gap session
      Mean.init_zero();
      RMS.init_zero();
      StdDev.init_zero();
      Min.init_zero();
      Max.init_zero();

      Sum.init_zero();
      Sum2.init_zero();

      // reset activations counter
      nGapAct = 0;
    }

  // one more activation
  ++nGapAct;

  // compute basic statistics
  for(i = 0; i < x.dim(); ++i){
    Sum[i] += x[i];
    Sum2[i] += x[i] * x[i];

    if(nGapAct == 1){
      Min[i] = x[i];
      Max[i] = x[i];
    }else{
      if(x[i] < Min[i]){
	Min[i] = x[i];
      }
      if(x[i] > Max[i]){
	Max[i] = x[i];
      }
    }

    Mean[i] = Sum[i] / nGapAct;
    RMS[i] = Sum2[i] / nGapAct;
    StdDev[i] = sqrt(RMS[i] - Mean[i] * Mean[i]);

  }// for each item of input dimension

  // compute final statistics
  NaReal	fAbs;
  if(fabs(Min[0]) > fabs(Max[0]))
    fAbs = fabs(Min[0]);
  else
    fAbs = fabs(Max[0]);

  int	id, j = 0;
  NaReal	fTime = net()->timer().CurrentTime();
  int		iTimeIndex = net()->timer().CurrentIndex();

  // put needed statistics to output
  for(id = 0; id < NaSI_number; ++id){
    switch(mOutStat & NaSIdToMask(id))
      {
      case NaSM_ABSMEAN:stat.data()[j++] = fabs(Mean[0]);break;
      case NaSM_MEAN:	stat.data()[j++] = Mean[0];	break;
      case NaSM_RMS:	stat.data()[j++] = RMS[0];	break;
      case NaSM_STDDEV:	stat.data()[j++] = StdDev[0];	break;
      case NaSM_MAX:	stat.data()[j++] = Max[0];	break;
      case NaSM_MIN:	stat.data()[j++] = Min[0];	break;
      case NaSM_ABSMAX:	stat.data()[j++] = fAbs;	break;
      case NaSM_TIME:	stat.data()[j++] = fTime;	break;
      case NaSM_TINDEX: stat.data()[j++] = iTimeIndex;	break;
      case NaSM_VALUE:  stat.data()[j++] = x[0];	break;
      }
  }

  // check some statistics for halt condition
  if(nGapAct >= nGapWidth && nGapWidth > 0)
    {
      int	mHaltedBy = 0;
      for(id = 0; id < NaSI_number; ++id){
	switch(mHalt & NaSIdToMask(id))
	  {
	  case NaSM_ABSMEAN:
	    mHaltedBy |=
	      check_condition(fabs(Mean[0]), HaltCond[id].sign,
			      HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_MEAN:
	    mHaltedBy |=
	      check_condition(Mean[0], HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_RMS:
	    mHaltedBy |=
	      check_condition(RMS[0], HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_STDDEV:
	    mHaltedBy |=
	      check_condition(StdDev[0], HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_MAX:
	    mHaltedBy |=
	      check_condition(Max[0], HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_MIN:
	    mHaltedBy |=
	      check_condition(Min[0], HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_ABSMAX:
	    mHaltedBy |=
	      check_condition(fAbs, HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_TIME:
	    mHaltedBy |=
	      check_condition(fTime, HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  case NaSM_TINDEX:
	    mHaltedBy |=
	      check_condition(iTimeIndex, HaltCond[id].sign, HaltCond[id].value)
	      ? NaSIdToMask(id) : 0;
	    break;
	  }// switch
      }// for each id

      // if any of halt flags is true...
      if(mHaltedBy & NaSM_ALL){
	NaPrintLog("Statistics node '%s' caused halt due to:\n", name());
	for(id = 0; id < NaSI_number; ++id){
	  if(mHaltedBy & NaSIdToMask(id))
	    NaPrintLog("  %s[0] %s %g\n", szId[id],
		       szSign[1 + HaltCond[id].sign], HaltCond[id].value);
	}

	// some halt condition results true
	halt();
      }
    }
}